

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall helics::BrokerBase::processBaseCommands(BrokerBase *this,ActionMessage *command)

{
  string_view delimiters;
  string_view line;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  string_view quoteChars;
  string_view V;
  string_view V_00;
  string_view trimCharacters;
  string_view level;
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  __int_type_conflict _Var2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  element_type *peVar7;
  int *piVar8;
  long in_RSI;
  pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  int newLogLevel;
  ActionMessage udisconnect;
  string_viewVector res;
  size_type commentLoc;
  string_view cmd;
  memory_order __b;
  ActionMessage *message;
  undefined4 uVar10;
  int index;
  LogManager *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  action_t in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  undefined7 in_stack_fffffffffffffbc8;
  undefined7 uVar11;
  char in_stack_fffffffffffffbcf;
  undefined1 uVar12;
  undefined4 in_stack_fffffffffffffbd0;
  GlobalFederateId in_stack_fffffffffffffbd4;
  GlobalFederateId destination;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  char *in_stack_fffffffffffffbe8;
  string_view *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  char *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffcfb;
  int in_stack_fffffffffffffcfc;
  BrokerBase *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  GlobalFederateId in_stack_fffffffffffffd1c;
  GlobalFederateId local_294 [5];
  size_t local_280;
  char *local_278;
  __sv_type local_270;
  __sv_type local_260;
  ActionMessage *local_250;
  undefined8 uStack_248;
  __sv_type local_240;
  BaseType local_230;
  GlobalFederateId local_22c [5];
  size_t local_218;
  char *local_210;
  string_view in_stack_fffffffffffffe40;
  ActionMessage *local_150;
  undefined8 uStack_148;
  GlobalFederateId local_12c [5];
  size_t local_118;
  char *local_110;
  size_t local_f8;
  char *local_f0;
  undefined4 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_b1;
  undefined8 local_b0;
  char *local_a8;
  size_t local_90;
  char *local_88;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_80;
  undefined8 local_68;
  char *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  string_view local_40;
  int local_18;
  memory_order local_14;
  int local_10;
  int local_c;
  int *local_8;
  
  local_40 = SmallBuffer::to_string((SmallBuffer *)0x44ac53);
  local_48 = std::basic_string_view<char,_std::char_traits<char>_>::find
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        CONCAT44(in_stack_fffffffffffffbd4.gid,in_stack_fffffffffffffbd0),
                        in_stack_fffffffffffffbcf,
                        CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  if (local_48 != 0xffffffffffffffff) {
    local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                          CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                          CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    local_40 = local_58;
  }
  local_68 = 4;
  local_60 = " \t\n\r";
  trimCharacters._M_str = in_stack_fffffffffffffc00;
  trimCharacters._M_len = in_stack_fffffffffffffbf8;
  gmlc::utilities::string_viewOps::trimString(in_stack_fffffffffffffbf0,trimCharacters);
  local_90 = local_40._M_len;
  local_88 = local_40._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (char *)in_stack_fffffffffffffba8);
  local_b0 = 3;
  local_a8 = "\'\"`";
  message = (ActionMessage *)0x3;
  uVar10 = 0x71452f;
  index = 0;
  line._M_len._4_4_ = in_stack_fffffffffffffbb4;
  line._M_len._0_4_ = in_stack_fffffffffffffbb0;
  line._M_str._0_4_ = in_stack_fffffffffffffbb8;
  line._M_str._4_4_ = in_stack_fffffffffffffbbc;
  delimiters._M_str = (char *)in_stack_fffffffffffffba8;
  delimiters._M_len = (size_t)"\'\"`";
  quoteChars._M_len._4_4_ = in_stack_fffffffffffffbd4.gid;
  quoteChars._M_len._0_4_ = in_stack_fffffffffffffbd0;
  quoteChars._M_str._0_4_ = in_stack_fffffffffffffbd8;
  quoteChars._M_str._4_4_ = in_stack_fffffffffffffbdc;
  gmlc::utilities::string_viewOps::splitlineQuotes(line,delimiters,quoteChars,on);
  bVar1 = CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  if (bVar1) {
    local_b1 = 1;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x44adf8);
    CLI::std::
    pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pair<bool,_true>((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        *)CONCAT44(index,uVar10),(bool *)message,
                       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)0x44ae15);
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  }
  else {
    pvVar4 = CLI::std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[](&local_80,0);
    local_f8 = pvVar4->_M_len;
    local_f0 = pvVar4->_M_str;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (char *)in_stack_fffffffffffffba8);
    __x._M_len._7_1_ = in_stack_fffffffffffffbcf;
    __x._M_len._0_7_ = in_stack_fffffffffffffbc8;
    __x._M_str._0_4_ = in_stack_fffffffffffffbd0;
    __x._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
    __y._M_len._4_4_ = in_stack_fffffffffffffbbc;
    __y._M_len._0_4_ = in_stack_fffffffffffffbb8;
    __y._M_str._0_4_ = in_stack_fffffffffffffbc0;
    __y._M_str._4_4_ = in_stack_fffffffffffffbc4;
    bVar1 = std::operator==(__x,__y);
    bVar9._M_str = in_stack_fffffffffffffc08;
    bVar9._M_len = (size_t)message;
    if (!bVar1) {
      pvVar4 = CLI::std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&local_80,0);
      local_118 = pvVar4->_M_len;
      local_110 = pvVar4->_M_str;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (char *)in_stack_fffffffffffffba8);
      __x_00._M_len._7_1_ = in_stack_fffffffffffffbcf;
      __x_00._M_len._0_7_ = in_stack_fffffffffffffbc8;
      __x_00._M_str._0_4_ = in_stack_fffffffffffffbd0;
      __x_00._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
      __y_00._M_len._4_4_ = in_stack_fffffffffffffbbc;
      __y_00._M_len._0_4_ = in_stack_fffffffffffffbb8;
      __y_00._M_str._0_4_ = in_stack_fffffffffffffbc0;
      __y_00._M_str._4_4_ = in_stack_fffffffffffffbc4;
      bVar1 = std::operator==(__x_00,__y_00);
      if (bVar1) {
        if ((*(byte *)(in_RSI + 0x211) & 1) != 0) {
          _Var2 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffba8);
          if (5 < _Var2) {
            GlobalFederateId::GlobalFederateId
                      (local_12c,(GlobalBrokerId)*(BaseType *)(in_RSI + 0xc));
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(index,uVar10));
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       (char *)in_stack_fffffffffffffba8);
            uVar10 = (undefined4)uStack_148;
            index = (int)((ulong)uStack_148 >> 0x20);
            name._M_str = in_stack_fffffffffffffd10;
            name._M_len = in_stack_fffffffffffffd08;
            sendToLogger(in_stack_fffffffffffffd00,in_stack_fffffffffffffd1c,
                         in_stack_fffffffffffffcfc,name,in_stack_fffffffffffffe40,
                         (bool)in_stack_fffffffffffffcfb);
            message = local_150;
          }
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbbc);
          addActionMessage((BrokerBase *)CONCAT44(index,uVar10),message);
          ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(index,uVar10));
        }
        bVar9._M_str = in_stack_fffffffffffffc08;
        bVar9._M_len = (size_t)message;
      }
      else {
        pvVar4 = CLI::std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[](&local_80,0);
        local_218 = pvVar4->_M_len;
        local_210 = pvVar4->_M_str;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (char *)in_stack_fffffffffffffba8);
        __x_01._M_len._7_1_ = in_stack_fffffffffffffbcf;
        __x_01._M_len._0_7_ = in_stack_fffffffffffffbc8;
        __x_01._M_str._0_4_ = in_stack_fffffffffffffbd0;
        __x_01._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
        __y_01._M_len._4_4_ = in_stack_fffffffffffffbbc;
        __y_01._M_len._0_4_ = in_stack_fffffffffffffbb8;
        __y_01._M_str._0_4_ = in_stack_fffffffffffffbc0;
        __y_01._M_str._4_4_ = in_stack_fffffffffffffbc4;
        bVar1 = std::operator==(__x_01,__y_01);
        if (bVar1) {
          _Var2 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffba8);
          if (5 < _Var2) {
            local_230 = *(BaseType *)(in_RSI + 0xc);
            GlobalFederateId::GlobalFederateId(local_22c,(GlobalBrokerId)local_230);
            local_240 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(index,uVar10));
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       (char *)in_stack_fffffffffffffba8);
            uVar10 = (undefined4)uStack_248;
            index = (int)((ulong)uStack_248 >> 0x20);
            name_00._M_str = in_stack_fffffffffffffd10;
            name_00._M_len = in_stack_fffffffffffffd08;
            sendToLogger(in_stack_fffffffffffffd00,in_stack_fffffffffffffd1c,
                         in_stack_fffffffffffffcfc,name_00,in_stack_fffffffffffffe40,
                         (bool)in_stack_fffffffffffffcfb);
            message = local_250;
          }
          ActionMessage::swapSourceDest((ActionMessage *)CONCAT44(index,uVar10));
          SmallBuffer::operator=
                    ((SmallBuffer *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                     (char (*) [11])CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
          ActionMessage::getString_abi_cxx11_((ActionMessage *)in_stack_fffffffffffffba8,index);
          local_260 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(index,uVar10));
          str._M_len._7_1_ = in_stack_fffffffffffffbcf;
          str._M_len._0_7_ = in_stack_fffffffffffffbc8;
          str._M_str._0_4_ = in_stack_fffffffffffffbd0;
          str._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
          ActionMessage::setString
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbbc,str);
          local_270 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(index,uVar10));
          str_00._M_len._7_1_ = in_stack_fffffffffffffbcf;
          str_00._M_len._0_7_ = in_stack_fffffffffffffbc8;
          str_00._M_str._0_4_ = in_stack_fffffffffffffbd0;
          str_00._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
          ActionMessage::setString
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbbc,str_00);
          addActionMessage((BrokerBase *)CONCAT44(index,uVar10),message);
          bVar9._M_str = in_stack_fffffffffffffc08;
          bVar9._M_len = (size_t)message;
        }
        else {
          pvVar4 = CLI::std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator[](&local_80,0);
          local_280 = pvVar4->_M_len;
          local_278 = pvVar4->_M_str;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     (char *)in_stack_fffffffffffffba8);
          __x_02._M_len._7_1_ = in_stack_fffffffffffffbcf;
          __x_02._M_len._0_7_ = in_stack_fffffffffffffbc8;
          __x_02._M_str._0_4_ = in_stack_fffffffffffffbd0;
          __x_02._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
          __y_02._M_len._4_4_ = in_stack_fffffffffffffbbc;
          __y_02._M_len._0_4_ = in_stack_fffffffffffffbb8;
          __y_02._M_str._0_4_ = in_stack_fffffffffffffbc0;
          __y_02._M_str._4_4_ = in_stack_fffffffffffffbc4;
          bVar1 = std::operator==(__x_02,__y_02);
          if (bVar1) {
            _Var2 = std::__atomic_base::operator_cast_to_int
                              ((__atomic_base<int> *)in_stack_fffffffffffffba8);
            bVar9._M_str = in_stack_fffffffffffffc08;
            bVar9._M_len = (size_t)message;
            if (5 < _Var2) {
              GlobalFederateId::GlobalFederateId
                        (local_294,(GlobalBrokerId)*(BaseType *)(in_RSI + 0xc));
              ActionMessage::getString_abi_cxx11_((ActionMessage *)in_stack_fffffffffffffba8,index);
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(index,uVar10));
              SmallBuffer::to_string((SmallBuffer *)0x44b381);
              bVar9 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                                 CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
              uVar10 = bVar9._M_str._0_4_;
              index = bVar9._M_str._4_4_;
              name_01._M_str = in_stack_fffffffffffffd10;
              name_01._M_len = in_stack_fffffffffffffd08;
              sendToLogger(in_stack_fffffffffffffd00,in_stack_fffffffffffffd1c,
                           in_stack_fffffffffffffcfc,name_01,in_stack_fffffffffffffe40,
                           (bool)in_stack_fffffffffffffcfb);
            }
          }
          else {
            CLI::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator[](&local_80,0);
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       (char *)in_stack_fffffffffffffba8);
            __x_03._M_len._7_1_ = in_stack_fffffffffffffbcf;
            __x_03._M_len._0_7_ = in_stack_fffffffffffffbc8;
            __x_03._M_str._0_4_ = in_stack_fffffffffffffbd0;
            __x_03._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
            __y_03._M_len._4_4_ = in_stack_fffffffffffffbbc;
            __y_03._M_len._0_4_ = in_stack_fffffffffffffbb8;
            __y_03._M_str._0_4_ = in_stack_fffffffffffffbc0;
            __y_03._M_str._4_4_ = in_stack_fffffffffffffbc4;
            bVar1 = std::operator==(__x_03,__y_03);
            if (bVar1) {
              sVar5 = CLI::std::
                      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::size(&local_80);
              if (sVar5 < 2) {
                peVar7 = CLI::std::
                         __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x44b5db);
                LogManager::getLogBuffer(peVar7);
                LogBuffer::enable((LogBuffer *)CONCAT44(index,uVar10),
                                  SUB81((ulong)message >> 0x38,0));
              }
              else {
                CLI::std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&local_80,1);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                           (char *)in_stack_fffffffffffffba8);
                __x_04._M_len._7_1_ = in_stack_fffffffffffffbcf;
                __x_04._M_len._0_7_ = in_stack_fffffffffffffbc8;
                __x_04._M_str._0_4_ = in_stack_fffffffffffffbd0;
                __x_04._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
                __y_04._M_len._4_4_ = in_stack_fffffffffffffbbc;
                __y_04._M_len._0_4_ = in_stack_fffffffffffffbb8;
                __y_04._M_str._0_4_ = in_stack_fffffffffffffbc0;
                __y_04._M_str._4_4_ = in_stack_fffffffffffffbc4;
                bVar1 = std::operator==(__x_04,__y_04);
                if (bVar1) {
                  peVar7 = CLI::std::
                           __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x44b532);
                  LogManager::getLogBuffer(peVar7);
                  LogBuffer::enable((LogBuffer *)CONCAT44(index,uVar10),
                                    SUB81((ulong)message >> 0x38,0));
                }
                else {
                  peVar7 = CLI::std::
                           __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x44b565);
                  LogManager::getLogBuffer(peVar7);
                  CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::operator[](&local_80,1);
                  V._M_len._4_4_ = in_stack_fffffffffffffbe4;
                  V._M_len._0_4_ = in_stack_fffffffffffffbe0;
                  V._M_str = in_stack_fffffffffffffbe8;
                  gmlc::utilities::numeric_conversion<unsigned_long>
                            (V,CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                  LogBuffer::resize((LogBuffer *)
                                    CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                                    CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
                }
              }
            }
            else {
              CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::operator[](&local_80,0);
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (char *)in_stack_fffffffffffffba8);
              __x_05._M_len._7_1_ = in_stack_fffffffffffffbcf;
              __x_05._M_len._0_7_ = in_stack_fffffffffffffbc8;
              __x_05._M_str._0_4_ = in_stack_fffffffffffffbd0;
              __x_05._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
              __y_05._M_len._4_4_ = in_stack_fffffffffffffbbc;
              __y_05._M_len._0_4_ = in_stack_fffffffffffffbb8;
              __y_05._M_str._0_4_ = in_stack_fffffffffffffbc0;
              __y_05._M_str._4_4_ = in_stack_fffffffffffffbc4;
              bVar1 = std::operator==(__x_05,__y_05);
              if (!bVar1) {
                CLI::std::
                pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::
                pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_&,_true>
                          ((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)CONCAT44(index,uVar10),(bool *)message,
                           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x44b988);
                goto LAB_0044b9d3;
              }
              sVar5 = CLI::std::
                      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::size(&local_80);
              if (sVar5 < 2) {
                uVar11 = (undefined7)(in_RSI + 0x1f8);
                uVar12 = (undefined1)((ulong)(in_RSI + 0x1f8) >> 0x38);
                peVar7 = CLI::std::
                         __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x44b84a);
                destination.gid = (BaseType)((ulong)peVar7 >> 0x20);
                peVar7 = CLI::std::
                         __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x44b86b);
                LogManager::getConsoleLevel(peVar7);
                LogManager::updateRemote
                          ((LogManager *)CONCAT17(uVar12,uVar11),destination,
                           in_stack_fffffffffffffbc4);
              }
              else {
                CLI::std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&local_80,1);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                           (char *)in_stack_fffffffffffffba8);
                __x_06._M_len._7_1_ = in_stack_fffffffffffffbcf;
                __x_06._M_len._0_7_ = in_stack_fffffffffffffbc8;
                __x_06._M_str._0_4_ = in_stack_fffffffffffffbd0;
                __x_06._M_str._4_4_ = in_stack_fffffffffffffbd4.gid;
                __y_06._M_len._4_4_ = in_stack_fffffffffffffbbc;
                __y_06._M_len._0_4_ = in_stack_fffffffffffffbb8;
                __y_06._M_str._0_4_ = in_stack_fffffffffffffbc0;
                __y_06._M_str._4_4_ = in_stack_fffffffffffffbc4;
                bVar1 = std::operator==(__x_06,__y_06);
                if (bVar1) {
                  CLI::std::
                  __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x44b6ff);
                  LogManager::updateRemote
                            ((LogManager *)
                             CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                             in_stack_fffffffffffffbd4,in_stack_fffffffffffffbc4);
                }
                else {
                  pvVar4 = CLI::std::
                           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ::operator[](&local_80,1);
                  pvVar6 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                     (pvVar4,0);
                  iVar3 = isdigit((int)*pvVar6);
                  if (iVar3 == 0) {
                    CLI::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::operator[](&local_80,1);
                    level._M_str = in_stack_fffffffffffffc08;
                    level._M_len = (size_t)in_stack_fffffffffffffc00;
                    logLevelFromString(level);
                  }
                  else {
                    CLI::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::operator[](&local_80,1);
                    V_00._M_len._4_4_ = in_stack_fffffffffffffbe4;
                    V_00._M_len._0_4_ = in_stack_fffffffffffffbe0;
                    V_00._M_str = in_stack_fffffffffffffbe8;
                    gmlc::utilities::numeric_conversion<int>(V_00,in_stack_fffffffffffffbdc);
                  }
                  CLI::std::
                  __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x44b803);
                  LogManager::updateRemote
                            ((LogManager *)
                             CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                             in_stack_fffffffffffffbd4,in_stack_fffffffffffffbc4);
                }
              }
              piVar8 = (int *)(in_RSI + 0x14);
              CLI::std::
              __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x44b8b2);
              local_c = LogManager::getMaxLevel(in_stack_fffffffffffffba8);
              local_10 = 5;
              local_8 = piVar8;
              local_14 = std::operator&(seq_cst,__memory_order_mask);
              local_18 = local_c;
              in_stack_fffffffffffffbb4 = local_10;
              if (local_10 == 3) {
                *piVar8 = local_c;
              }
              else if (local_10 == 5) {
                LOCK();
                *piVar8 = local_c;
                UNLOCK();
              }
              else {
                *piVar8 = local_c;
              }
            }
            bVar9._M_str = in_stack_fffffffffffffc08;
            bVar9._M_len = (size_t)message;
          }
        }
      }
    }
    CLI::std::
    pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::
    pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_&,_true>
              ((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                *)CONCAT44(index,uVar10),(bool *)bVar9._M_len,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)0x44b9c6);
  }
LAB_0044b9d3:
  local_e8 = 1;
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  return in_RDI;
}

Assistant:

std::pair<bool, std::vector<std::string_view>>
    BrokerBase::processBaseCommands(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " |",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return {true, {}};
    }
    if (res[0] == "ignore") {
    } else if (res[0] == "terminate") {
        if (allowRemoteControl) {
            LOG_SUMMARY(global_broker_id_local,
                        identifier,
                        " received terminate instruction via command instruction")
            const ActionMessage udisconnect(CMD_USER_DISCONNECT);
            addActionMessage(udisconnect);
        }
    } else if (res[0] == "echo") {
        LOG_SUMMARY(global_broker_id_local,
                    identifier,
                    " received echo command via command instruction")
        command.swapSourceDest();
        command.payload = "echo_reply";
        command.setString(targetStringLoc, command.getString(sourceStringLoc));
        command.setString(sourceStringLoc, identifier);
        addActionMessage(command);
    } else if (res[0] == "log") {
        LOG_SUMMARY(global_broker_id_local,
                    command.getString(sourceStringLoc),
                    command.payload.to_string().substr(4));
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLogLevel = HELICS_LOG_LEVEL_NO_PRINT;
                if (isdigit(res[1][0]) != 0) {
                    newLogLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1], HELICS_LOG_LEVEL_NO_PRINT);
                } else {
                    newLogLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLogLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel.store(mLogManager->getMaxLevel());
    } else {
        return {false, res};
    }
    return {true, res};
}